

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderBuiltinConstantTests.cpp
# Opt level: O0

string * deqp::gles31::Functional::anon_unknown_1::makeCaseName
                   (string *__return_storage_ptr__,string *varName)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  ostream *poVar5;
  ulong uStack_1a8;
  char c;
  size_t ndx;
  ostringstream local_190 [8];
  ostringstream name;
  string *varName_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)varName);
  cVar1 = de::toLower(*pcVar3);
  std::operator<<((ostream *)local_190,cVar1);
  uStack_1a8 = 4;
  while( true ) {
    uVar4 = std::__cxx11::string::length();
    if (uVar4 <= uStack_1a8) break;
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)varName);
    cVar1 = *pcVar3;
    bVar2 = de::isUpper(cVar1);
    if (bVar2) {
      poVar5 = std::operator<<((ostream *)local_190,'_');
      cVar1 = de::toLower(cVar1);
      std::operator<<(poVar5,cVar1);
    }
    else {
      std::operator<<((ostream *)local_190,cVar1);
    }
    uStack_1a8 = uStack_1a8 + 1;
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

static std::string makeCaseName (const std::string& varName)
{
	DE_ASSERT(varName.length() > 3);
	DE_ASSERT(varName.substr(0,3) == "gl_");

	std::ostringstream name;
	name << de::toLower(char(varName[3]));

	for (size_t ndx = 4; ndx < varName.length(); ndx++)
	{
		const char c = char(varName[ndx]);
		if (de::isUpper(c))
			name << '_' << de::toLower(c);
		else
			name << c;
	}

	return name.str();
}